

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O0

int read_line_info(backtrace_state *state,dwarf_data *ddata,backtrace_error_callback error_callback,
                  void *data,unit *u,line_header *hdr,line **lines,size_t *lines_count)

{
  int iVar1;
  line *ln;
  uchar *puStack_a8;
  int is_dwarf64;
  uint64_t len;
  dwarf_buf line_buf;
  line_vector vec;
  line_header *hdr_local;
  unit *u_local;
  void *data_local;
  backtrace_error_callback error_callback_local;
  dwarf_data *ddata_local;
  backtrace_state *state_local;
  
  memset(&line_buf.reported_underflow,0,0x18);
  memset(hdr,0,0x48);
  if ((u->lineoff == u->lineoff) && ((ulong)u->lineoff < (ddata->dwarf_sections).size[1])) {
    len = (uint64_t)anon_var_dwarf_55de7;
    line_buf.name = (char *)(ddata->dwarf_sections).data[1];
    line_buf.start = (ddata->dwarf_sections).data[1] + u->lineoff;
    line_buf.buf = (uchar *)((ddata->dwarf_sections).size[1] - u->lineoff);
    line_buf.left._0_4_ = ddata->is_bigendian;
    line_buf.data._0_4_ = 0;
    line_buf._32_8_ = error_callback;
    line_buf.error_callback = (backtrace_error_callback)data;
    puStack_a8 = (uchar *)read_initial_length((dwarf_buf *)&len,(int *)((long)&ln + 4));
    line_buf.buf = puStack_a8;
    iVar1 = read_line_header(state,ddata,u,ln._4_4_,(dwarf_buf *)&len,hdr);
    if (iVar1 != 0) {
      read_line_program(state,ddata,hdr,(dwarf_buf *)&len,
                        (line_vector *)&line_buf.reported_underflow);
    }
  }
  else {
    (*error_callback)(data,"unit line offset out of range",0);
  }
  backtrace_vector_free(state,(backtrace_vector *)&line_buf.reported_underflow,error_callback,data);
  free_line_header(state,hdr,error_callback,data);
  *lines = (line *)0xffffffffffffffff;
  *lines_count = 0;
  return 0;
}

Assistant:

static int
read_line_info (struct backtrace_state *state, struct dwarf_data *ddata,
		backtrace_error_callback error_callback, void *data,
		struct unit *u, struct line_header *hdr, struct line **lines,
		size_t *lines_count)
{
  struct line_vector vec;
  struct dwarf_buf line_buf;
  uint64_t len;
  int is_dwarf64;
  struct line *ln;

  memset (&vec.vec, 0, sizeof vec.vec);
  vec.count = 0;

  memset (hdr, 0, sizeof *hdr);

  if (u->lineoff != (off_t) (size_t) u->lineoff
      || (size_t) u->lineoff >= ddata->dwarf_sections.size[DEBUG_LINE])
    {
      error_callback (data, "unit line offset out of range", 0);
      goto fail;
    }

  line_buf.name = ".debug_line";
  line_buf.start = ddata->dwarf_sections.data[DEBUG_LINE];
  line_buf.buf = ddata->dwarf_sections.data[DEBUG_LINE] + u->lineoff;
  line_buf.left = ddata->dwarf_sections.size[DEBUG_LINE] - u->lineoff;
  line_buf.is_bigendian = ddata->is_bigendian;
  line_buf.error_callback = error_callback;
  line_buf.data = data;
  line_buf.reported_underflow = 0;

  len = read_initial_length (&line_buf, &is_dwarf64);
  line_buf.left = len;

  if (!read_line_header (state, ddata, u, is_dwarf64, &line_buf, hdr))
    goto fail;

  if (!read_line_program (state, ddata, hdr, &line_buf, &vec))
    goto fail;

  if (line_buf.reported_underflow)
    goto fail;

  if (vec.count == 0)
    {
      /* This is not a failure in the sense of generating an error,
	 but it is a failure in that sense that we have no useful
	 information.  */
      goto fail;
    }

  /* Allocate one extra entry at the end.  */
  ln = ((struct line *)
	backtrace_vector_grow (state, sizeof (struct line), error_callback,
			       data, &vec.vec));
  if (ln == NULL)
    goto fail;
  ln->pc = (uintptr_t) -1;
  ln->filename = NULL;
  ln->lineno = 0;
  ln->idx = 0;

  if (!backtrace_vector_release (state, &vec.vec, error_callback, data))
    goto fail;

  ln = (struct line *) vec.vec.base;
  backtrace_qsort (ln, vec.count, sizeof (struct line), line_compare);

  *lines = ln;
  *lines_count = vec.count;

  return 1;

 fail:
  backtrace_vector_free (state, &vec.vec, error_callback, data);
  free_line_header (state, hdr, error_callback, data);
  *lines = (struct line *) (uintptr_t) -1;
  *lines_count = 0;
  return 0;
}